

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::LogParser::EndElement(LogParser *this,string *name)

{
  RegularExpression *this_00;
  bool bVar1;
  pointer pcVar2;
  Revision *pRVar3;
  string *psVar4;
  string local_40;
  
  bVar1 = std::operator==(name,"log");
  if (bVar1) {
    (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (this->BZR,&this->Rev,&this->Changes);
  }
  else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    bVar1 = std::operator==(name,"file");
    if ((bVar1) || (bVar1 = std::operator==(name,"directory"), bVar1)) {
      pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001bc523;
      bVar1 = std::operator==(name,"symlink");
      pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (!bVar1) {
        if (pcVar2 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          bVar1 = std::operator==(name,"committer");
          pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (bVar1) {
            psVar4 = &(this->Rev).Author;
            std::__cxx11::string::assign((char *)psVar4,(ulong)pcVar2);
            this_00 = &this->EmailRegex;
            bVar1 = cmsys::RegularExpression::find(this_00,psVar4);
            if (bVar1) {
              cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_40,&this_00->regmatch,1);
              std::__cxx11::string::operator=((string *)psVar4,(string *)&local_40);
              std::__cxx11::string::~string((string *)&local_40);
              cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_40,&this_00->regmatch,2);
              std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_40);
              std::__cxx11::string::~string((string *)&local_40);
            }
          }
          else if (pcVar2 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish) {
            bVar1 = std::operator==(name,"timestamp");
            pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar1) {
              pRVar3 = (Revision *)&(this->Rev).Date;
            }
            else {
              if (pcVar2 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish) goto LAB_001bc523;
              bVar1 = std::operator==(name,"message");
              pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (bVar1) {
                pRVar3 = (Revision *)&(this->Rev).Log;
              }
              else {
                if ((pcVar2 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl
                               .super__Vector_impl_data._M_finish) ||
                   (bVar1 = std::operator==(name,"revno"), !bVar1)) goto LAB_001bc523;
                pRVar3 = &this->Rev;
                pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
            }
            std::__cxx11::string::assign((char *)pRVar3,(ulong)pcVar2);
          }
        }
        goto LAB_001bc523;
      }
    }
    psVar4 = &(this->CurChange).Path;
    std::__cxx11::string::assign((char *)psVar4,(ulong)pcVar2);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar4);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
  }
LAB_001bc523:
  pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "log") {
      this->BZR->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() &&
               (name == "file" || name == "directory")) {
      this->CurChange.Path.assign(this->CData.data(), this->CData.size());
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "symlink") {
      // symlinks have an arobase at the end in the log
      this->CurChange.Path.assign(this->CData.data(), this->CData.size() - 1);
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "committer") {
      this->Rev.Author.assign(this->CData.data(), this->CData.size());
      if (this->EmailRegex.find(this->Rev.Author)) {
        this->Rev.Author = this->EmailRegex.match(1);
        this->Rev.EMail = this->EmailRegex.match(2);
      }
    } else if (!this->CData.empty() && name == "timestamp") {
      this->Rev.Date.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "message") {
      this->Rev.Log.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "revno") {
      this->Rev.Rev.assign(this->CData.data(), this->CData.size());
    }
    this->CData.clear();
  }